

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPWritePGM(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  size_t __size;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  uint8_t *__ptr;
  int iVar6;
  int iVar7;
  uint8_t *__ptr_00;
  uint uVar8;
  uint uVar9;
  uint8_t *__ptr_01;
  uint8_t *local_50;
  
  uVar9 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    __size = (size_t)buffer->width;
    uVar1 = buffer->height;
    __ptr_01 = (buffer->u).RGBA.rgba;
    __ptr = (buffer->u).YUVA.u;
    local_50 = (buffer->u).YUVA.v;
    __ptr_00 = (buffer->u).YUVA.a;
    uVar8 = buffer->width + 1;
    iVar7 = (int)(uVar1 + 1) / 2;
    uVar9 = 0;
    uVar5 = uVar1;
    if (__ptr_00 == (uint8_t *)0x0) {
      uVar5 = uVar9;
    }
    if (local_50 != (uint8_t *)0x0 && (__ptr != (uint8_t *)0x0 && __ptr_01 != (uint8_t *)0x0)) {
      fprintf((FILE *)fout,"P5\n%d %d\n255\n",(ulong)(uVar8 & 0xfffffffe),
              (ulong)(iVar7 + uVar1 + uVar5));
      uVar9 = 1;
      for (iVar6 = 0; (uVar9 != 0 && (iVar6 < (int)uVar1)); iVar6 = iVar6 + 1) {
        sVar2 = fwrite(__ptr_01,__size,1,(FILE *)fout);
        if ((__size & 1) != 0) {
          fputc(0,(FILE *)fout);
        }
        uVar9 = (uint)(sVar2 == 1);
        __ptr_01 = __ptr_01 + (buffer->u).YUVA.y_stride;
      }
      sVar2 = (size_t)((int)uVar8 / 2);
      for (iVar6 = 0; (uVar9 != 0 && (iVar6 < iVar7)); iVar6 = iVar6 + 1) {
        sVar3 = fwrite(__ptr,sVar2,1,(FILE *)fout);
        sVar4 = fwrite(local_50,sVar2,1,(FILE *)fout);
        uVar9 = (uint)(sVar4 == 1 && sVar3 == 1);
        __ptr = __ptr + (buffer->u).YUVA.u_stride;
        local_50 = local_50 + (buffer->u).YUVA.v_stride;
      }
      for (iVar7 = 0; (uVar9 != 0 && (iVar7 < (int)uVar5)); iVar7 = iVar7 + 1) {
        sVar2 = fwrite(__ptr_00,__size,1,(FILE *)fout);
        if ((__size & 1) != 0) {
          fputc(0,(FILE *)fout);
        }
        uVar9 = (uint)(sVar2 == 1);
        __ptr_00 = __ptr_00 + (buffer->u).YUVA.a_stride;
      }
    }
  }
  return uVar9;
}

Assistant:

int WebPWritePGM(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    fprintf(fout, "P5\n%d %d\n255\n",
            (width + 1) & ~1, height + uv_height + a_height);
    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_a += yuv->a_stride;
    }
    return ok;
  }
}